

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O2

void duckdb_zstd::ZSTD_updateStats
               (optState_t *optPtr,U32 litLength,BYTE *literals,U32 offBase,U32 matchLength)

{
  uint uVar1;
  uint uVar2;
  U32 u;
  ulong uVar3;
  
  if (optPtr->literalCompressionMode != ZSTD_ps_disable) {
    for (uVar3 = 0; litLength != uVar3; uVar3 = uVar3 + 1) {
      optPtr->litFreq[literals[uVar3]] = optPtr->litFreq[literals[uVar3]] + 2;
    }
    optPtr->litSum = optPtr->litSum + litLength * 2;
  }
  if (litLength < 0x40) {
    uVar2 = (uint)(byte)ZSTD_LLcode(unsigned_int)::LL_Code[litLength];
  }
  else {
    uVar2 = 0x1f;
    if (litLength != 0) {
      for (; litLength >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = (uVar2 ^ 0xffffffe0) + 0x33;
  }
  optPtr->litLengthFreq[uVar2] = optPtr->litLengthFreq[uVar2] + 1;
  optPtr->litLengthSum = optPtr->litLengthSum + 1;
  uVar2 = 0x1f;
  if (offBase != 0) {
    for (; offBase >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  optPtr->offCodeFreq[uVar2] = optPtr->offCodeFreq[uVar2] + 1;
  optPtr->offCodeSum = optPtr->offCodeSum + 1;
  uVar2 = matchLength - 3;
  if (uVar2 < 0x80) {
    uVar2 = (uint)(byte)(&ZSTD_MLcode(unsigned_int)::ML_Code)[uVar2];
  }
  else {
    uVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar2 = (uVar1 ^ 0xffffffe0) + 0x44;
  }
  optPtr->matchLengthFreq[uVar2] = optPtr->matchLengthFreq[uVar2] + 1;
  optPtr->matchLengthSum = optPtr->matchLengthSum + 1;
  return;
}

Assistant:

static int ZSTD_compressedLiterals(optState_t const* const optPtr)
{
    return optPtr->literalCompressionMode != ZSTD_ps_disable;
}